

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_cbs_auth.c
# Opt level: O2

AUTHENTICATION_HANDLE authentication_create(AUTHENTICATION_CONFIG *config)

{
  IOTHUB_AUTHORIZATION_HANDLE handle;
  void *pvVar1;
  AUTHENTICATION_HANDLE authentication_handle;
  char *pcVar2;
  STRING_HANDLE pSVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  
  if (config == (AUTHENTICATION_CONFIG *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (AUTHENTICATION_HANDLE)0x0;
    }
    pcVar2 = "authentication_create failed (config is NULL)";
    iVar5 = 0x1d1;
LAB_001326d9:
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
              ,"authentication_create",iVar5,1,pcVar2);
    return (AUTHENTICATION_HANDLE)0x0;
  }
  handle = config->authorization_module;
  if (handle == (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (AUTHENTICATION_HANDLE)0x0;
    }
    pcVar2 = "authentication_create failed (config->authorization_module is NULL)";
    iVar5 = 0x1d6;
    goto LAB_001326d9;
  }
  if (config->iothub_host_fqdn == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (AUTHENTICATION_HANDLE)0x0;
    }
    pcVar2 = "authentication_create failed (config->iothub_host_fqdn is NULL)";
    iVar5 = 0x1db;
    goto LAB_001326d9;
  }
  if (config->on_state_changed_callback == (ON_AUTHENTICATION_STATE_CHANGED_CALLBACK)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (AUTHENTICATION_HANDLE)0x0;
    }
    pcVar2 = "authentication_create failed (config->on_state_changed_callback is NULL)";
    iVar5 = 0x1e0;
    goto LAB_001326d9;
  }
  authentication_handle = (AUTHENTICATION_HANDLE)calloc(1,0x70);
  if (authentication_handle == (AUTHENTICATION_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (AUTHENTICATION_HANDLE)0x0;
    }
    pcVar2 = "authentication_create failed (malloc failed)";
    iVar5 = 0x1e9;
    goto LAB_001326d9;
  }
  pcVar2 = IoTHubClient_Auth_Get_DeviceId(handle);
  authentication_handle->device_id = pcVar2;
  if (pcVar2 == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00132741;
    pcVar2 = 
    "authentication_create failed (config->device_id could not be copied; STRING_construct failed)";
    iVar5 = 0x1f2;
  }
  else {
    pSVar3 = STRING_construct(config->iothub_host_fqdn);
    authentication_handle->iothub_host_fqdn = pSVar3;
    if (pSVar3 != (STRING_HANDLE)0x0) {
      authentication_handle->state = AUTHENTICATION_STATE_STOPPED;
      pcVar2 = IoTHubClient_Auth_Get_ModuleId(config->authorization_module);
      authentication_handle->module_id = pcVar2;
      pvVar1 = config->on_state_changed_callback_context;
      authentication_handle->on_state_changed_callback = config->on_state_changed_callback;
      authentication_handle->on_state_changed_callback_context = pvVar1;
      pvVar1 = config->on_error_callback_context;
      authentication_handle->on_error_callback = config->on_error_callback;
      authentication_handle->on_error_callback_context = pvVar1;
      authentication_handle->cbs_request_timeout_secs = 0xffffffff;
      authentication_handle->authorization_module = config->authorization_module;
      return authentication_handle;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00132741;
    pcVar2 = 
    "authentication_create failed (config->iothub_host_fqdn could not be copied; STRING_construct failed)"
    ;
    iVar5 = 0x1f7;
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
            ,"authentication_create",iVar5,1,pcVar2);
LAB_00132741:
  authentication_destroy(authentication_handle);
  return (AUTHENTICATION_HANDLE)0x0;
}

Assistant:

AUTHENTICATION_HANDLE authentication_create(const AUTHENTICATION_CONFIG* config)
{
    AUTHENTICATION_HANDLE result;

    if (config == NULL)
    {
        result = NULL;
        LogError("authentication_create failed (config is NULL)");
    }
    else if (config->authorization_module == NULL)
    {
        result = NULL;
        LogError("authentication_create failed (config->authorization_module is NULL)");
    }
    else if (config->iothub_host_fqdn == NULL)
    {
        result = NULL;
        LogError("authentication_create failed (config->iothub_host_fqdn is NULL)");
    }
    else if (config->on_state_changed_callback == NULL)
    {
        result = NULL;
        LogError("authentication_create failed (config->on_state_changed_callback is NULL)");
    }
    else
    {
        AUTHENTICATION_INSTANCE* instance;

        if ((instance = (AUTHENTICATION_INSTANCE*)malloc(sizeof(AUTHENTICATION_INSTANCE))) == NULL)
        {
            result = NULL;
            LogError("authentication_create failed (malloc failed)");
        }
        else
        {
            memset(instance, 0, sizeof(AUTHENTICATION_INSTANCE));

            if ((instance->device_id = IoTHubClient_Auth_Get_DeviceId(config->authorization_module) ) == NULL)
            {
                result = NULL;
                LogError("authentication_create failed (config->device_id could not be copied; STRING_construct failed)");
            }
            else if ((instance->iothub_host_fqdn = STRING_construct(config->iothub_host_fqdn)) == NULL)
            {
                result = NULL;
                LogError("authentication_create failed (config->iothub_host_fqdn could not be copied; STRING_construct failed)");
            }
            else
            {
                instance->state = AUTHENTICATION_STATE_STOPPED;

                instance->module_id = IoTHubClient_Auth_Get_ModuleId(config->authorization_module);

                instance->on_state_changed_callback = config->on_state_changed_callback;
                instance->on_state_changed_callback_context = config->on_state_changed_callback_context;

                instance->on_error_callback = config->on_error_callback;
                instance->on_error_callback_context = config->on_error_callback_context;

                instance->cbs_request_timeout_secs = DEFAULT_CBS_REQUEST_TIMEOUT_SECS;

                instance->authorization_module = config->authorization_module;

                result = (AUTHENTICATION_HANDLE)instance;
            }

            if (result == NULL)
            {
                authentication_destroy((AUTHENTICATION_HANDLE)instance);
            }
        }
    }

    return result;
}